

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_2::PtexUtils::genRfaceids
               (FaceInfo *faces,int nfaces,uint32_t *rfaceids,uint32_t *faceids)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint *__buffer;
  ulong uVar3;
  long __buffer_size;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pair<unsigned_int_*,_long> pVar7;
  
  auVar1 = _DAT_02d11120;
  if (0 < nfaces) {
    lVar2 = (ulong)(uint)nfaces - 1;
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_02d11120;
    auVar5 = _DAT_0045faa0;
    do {
      auVar6 = auVar5 ^ auVar1;
      if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                  auVar4._4_4_ < auVar6._4_4_) & 1)) {
        faceids[uVar3] = (uint32_t)uVar3;
      }
      if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
          auVar6._12_4_ <= auVar4._12_4_) {
        faceids[uVar3 + 1] = (uint32_t)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar2 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar2 + 2;
    } while ((nfaces + 1U & 0xfffffffe) != uVar3);
  }
  if (nfaces != 0) {
    lVar2 = (long)nfaces;
    pVar7 = std::get_temporary_buffer<unsigned_int>
                      ((long)(int)((lVar2 - (lVar2 + 1 >> 0x3f)) + 1U >> 1));
    __buffer_size = pVar7.second;
    __buffer = pVar7.first;
    if (__buffer == (uint *)0x0) {
      __buffer_size = 0;
      std::
      __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + lVar2,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
    }
    else {
      std::
      __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + lVar2,__buffer,__buffer_size,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
    }
    operator_delete(__buffer,__buffer_size << 2);
    if (0 < nfaces) {
      uVar3 = 0;
      do {
        rfaceids[faceids[uVar3]] = (uint32_t)uVar3;
        uVar3 = uVar3 + 1;
      } while ((uint)nfaces != uVar3);
    }
  }
  return;
}

Assistant:

void genRfaceids(const FaceInfo* faces, int nfaces,
                 uint32_t* rfaceids, uint32_t* faceids)
{
    // stable_sort faceids by smaller dimension (u or v) in descending order
    // treat const faces as having res of 1

    // init faceids
    for (int i = 0; i < nfaces; i++) faceids[i] = i;

    // sort faceids by rfaceid
    std::stable_sort(faceids, faceids + nfaces, CompareRfaceIds(faces));

    // generate mapping from faceid to rfaceid
    for (int i = 0; i < nfaces; i++) {
        // note: i is the rfaceid
        rfaceids[faceids[i]] = i;
    }
}